

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score_test.cc
# Opt level: O2

void __thiscall xLearn::LinearScoreTest::LinearScoreTest(LinearScoreTest *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014a398;
  return;
}

Assistant:

virtual void SetUp() {
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.num_param = kLength;
    param.loss_func = "squared";
    param.score_func = "linear";
    param.num_feature = kLength;
  }